

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O0

void __thiscall Clique::printSet(Clique *this,ostream *os)

{
  _Setw _Var1;
  ostream *this_00;
  ostream *in_RSI;
  size_type unaff_retaddr;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  size_t i;
  int n;
  ulong local_20;
  int local_14;
  
  std::operator<<(in_RSI,"[");
  local_14 = 0;
  local_20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25f1ff);
  while (local_20 != 0xffffffffffffffff) {
    if (0 < local_14) {
      std::operator<<(in_RSI,",");
    }
    _Var1 = std::setw(3);
    this_00 = std::operator<<(in_RSI,_Var1);
    std::ostream::operator<<(this_00,local_20);
    local_20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                         (in_stack_00000008,unaff_retaddr);
    local_14 = local_14 + 1;
  }
  std::operator<<(in_RSI,"]");
  return;
}

Assistant:

void Clique::printSet(std::ostream& os) {
	os << "[";
	int n = 0;
	for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
		if (n++>0) os << ",";
		os << setw(3) << i;
	}
	os << "]";
}